

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
gtl::internal_btree::
btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
::rebalance_left_to_right
          (btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
           *this,int to_move,
          btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
          *right,allocator_type *alloc)

{
  VType VVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  field_type fVar5;
  int iVar6;
  btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
  *pbVar7;
  btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
  *pbVar8;
  slot_type *psVar9;
  slot_type *psVar10;
  template_ElementType<2L> *ptVar11;
  template_ElementType<1L> *ptVar12;
  uint i;
  int iVar13;
  ulong local_48;
  slot_type *local_38;
  
  pbVar7 = parent(this);
  pbVar8 = parent(right);
  if (pbVar7 != pbVar8) {
    __assert_fail("parent() == right->parent()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                  ,0x627,
                  "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>]"
                 );
  }
  bVar2 = position(this);
  bVar3 = position(right);
  if (bVar2 + 1 != (uint)bVar3) {
    __assert_fail("position() + 1 == right->position()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                  ,0x628,
                  "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>]"
                 );
  }
  bVar2 = count(this);
  bVar3 = count(right);
  if (bVar2 < bVar3) {
    __assert_fail("count() >= right->count()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                  ,0x629,
                  "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>]"
                 );
  }
  if (0 < to_move) {
    bVar2 = count(this);
    if ((uint)to_move <= (uint)bVar2) {
      bVar2 = count(right);
      if ((uint)bVar2 < (uint)to_move) {
        bVar2 = count(right);
        uninitialized_move_n(right,(ulong)bVar2,0,(ulong)(uint)to_move,right,alloc);
        pbVar7 = parent(this);
        bVar2 = position(this);
        local_38 = slot(pbVar7,(uint)bVar2);
        btree_node<gtl::internal_btree::map_params<S2CellId,S2PointIndex<int>::PointData,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2PointIndex<int>::PointData>>,256,true>>
        ::value_init<absl::container_internal::slot_type<S2CellId,S2PointIndex<int>::PointData>*>
                  ((btree_node<gtl::internal_btree::map_params<S2CellId,S2PointIndex<int>::PointData,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2PointIndex<int>::PointData>>,256,true>>
                    *)right,(ulong)(to_move - 1U),alloc,&local_38);
        bVar2 = count(right);
        iVar6 = ~(uint)bVar2 + to_move;
        bVar2 = count(this);
        bVar3 = count(right);
        uninitialized_move_n(this,(long)iVar6,(ulong)bVar2 - (long)iVar6,(ulong)bVar3,right,alloc);
        bVar2 = count(this);
        psVar9 = slot(this,(uint)bVar2 - (to_move - 1U));
        bVar2 = count(this);
        psVar10 = slot(this,(uint)bVar2 - iVar6);
        ptVar11 = btree_node<gtl::internal_btree::map_params<S2CellId,S2PointIndex<int>::PointData,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2PointIndex<int>::PointData>>,256,true>>
                  ::GetField<2l>((btree_node<gtl::internal_btree::map_params<S2CellId,S2PointIndex<int>::PointData,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2PointIndex<int>::PointData>>,256,true>>
                                  *)right);
        absl::container_internal::slot_type<S2CellId,S2PointIndex<int>::PointData>::
        move<std::allocator<std::pair<S2CellId_const,S2PointIndex<int>::PointData>>>
                  (alloc,psVar9,psVar10,ptVar11);
      }
      else {
        bVar2 = count(right);
        bVar3 = count(right);
        uninitialized_move_n
                  (right,(ulong)(uint)to_move,(long)(int)((uint)bVar2 - to_move),(ulong)bVar3,right,
                   alloc);
        bVar2 = count(right);
        psVar9 = slot(right,~to_move + (uint)bVar2);
        bVar2 = count(right);
        psVar10 = slot(right,bVar2 - 1);
        ptVar11 = btree_node<gtl::internal_btree::map_params<S2CellId,S2PointIndex<int>::PointData,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2PointIndex<int>::PointData>>,256,true>>
                  ::GetField<2l>((btree_node<gtl::internal_btree::map_params<S2CellId,S2PointIndex<int>::PointData,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2PointIndex<int>::PointData>>,256,true>>
                                  *)right);
        for (; ptVar11 <= psVar9; psVar9 = psVar9 + -1) {
          (psVar10->value).first.id_ = (psVar9->value).first.id_;
          (psVar10->value).second.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>.
          super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
               (psVar9->value).second.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>.
               super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl;
          VVar1 = (psVar9->value).second.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>.
                  super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl.c_[1];
          (psVar10->value).second.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>.
          super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl.c_[0] =
               (psVar9->value).second.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>.
               super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl.c_[0];
          (psVar10->value).second.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>.
          super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl.c_[1] = VVar1;
          (psVar10->value).second.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>.
          super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl.c_[2] =
               (psVar9->value).second.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>.
               super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl.c_[2];
          psVar10 = psVar10 + -1;
        }
        pbVar7 = parent(this);
        bVar2 = position(this);
        psVar9 = slot(pbVar7,(uint)bVar2);
        psVar10 = slot(right,to_move + -1);
        (psVar10->value).first.id_ = (psVar9->value).first.id_;
        (psVar10->value).second.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>.
        super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
             (psVar9->value).second.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>.
             super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl;
        (psVar10->value).second.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>.
        super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl.c_[2] =
             (psVar9->value).second.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>.
             super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl.c_[2];
        VVar1 = (psVar9->value).second.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>.
                super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl.c_[1];
        (psVar10->value).second.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>.
        super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl.c_[0] =
             (psVar9->value).second.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>.
             super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl.c_[0];
        (psVar10->value).second.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>.
        super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl.c_[1] = VVar1;
        bVar2 = count(this);
        psVar9 = slot(this,(uint)bVar2 - (to_move + -1));
        bVar2 = count(this);
        psVar10 = slot(this,(uint)bVar2);
        ptVar11 = btree_node<gtl::internal_btree::map_params<S2CellId,S2PointIndex<int>::PointData,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2PointIndex<int>::PointData>>,256,true>>
                  ::GetField<2l>((btree_node<gtl::internal_btree::map_params<S2CellId,S2PointIndex<int>::PointData,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2PointIndex<int>::PointData>>,256,true>>
                                  *)right);
        absl::container_internal::slot_type<S2CellId,S2PointIndex<int>::PointData>::
        move<std::allocator<std::pair<S2CellId_const,S2PointIndex<int>::PointData>>>
                  (alloc,psVar9,psVar10,ptVar11);
      }
      local_48 = (ulong)(uint)to_move;
      bVar2 = count(this);
      psVar9 = slot(this,(uint)bVar2 - to_move);
      pbVar7 = parent(this);
      bVar2 = position(this);
      psVar10 = slot(pbVar7,(uint)bVar2);
      (psVar10->value).first.id_ = (psVar9->value).first.id_;
      (psVar10->value).second.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>.
      super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
           (psVar9->value).second.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>.
           super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl;
      (psVar10->value).second.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>.
      super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl.c_[2] =
           (psVar9->value).second.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>.
           super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl.c_[2];
      VVar1 = (psVar9->value).second.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>.
              super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl.c_[1];
      (psVar10->value).second.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>.
      super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl.c_[0] =
           (psVar9->value).second.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>.
           super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl.c_[0];
      (psVar10->value).second.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>.
      super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl.c_[1] = VVar1;
      bVar2 = count(this);
      value_destroy_n(this,(long)(int)((uint)bVar2 - to_move),local_48,alloc);
      bVar4 = leaf(this);
      if (!bVar4) {
        bVar2 = count(right);
        for (i = (uint)bVar2; -1 < (int)i; i = i - 1) {
          pbVar7 = child(right,i);
          init_child(right,to_move + i,pbVar7);
          btree_node<gtl::internal_btree::map_params<S2CellId,S2PointIndex<int>::PointData,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2PointIndex<int>::PointData>>,256,true>>
          ::GetField<3l>((btree_node<gtl::internal_btree::map_params<S2CellId,S2PointIndex<int>::PointData,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2PointIndex<int>::PointData>>,256,true>>
                          *)right);
        }
        iVar6 = 1;
        iVar13 = -to_move;
        while (iVar13 = iVar13 + 1, iVar13 != 1) {
          bVar2 = count(this);
          pbVar7 = child(this,(uint)bVar2 + iVar13);
          init_child(right,iVar6 + -1,pbVar7);
          count(this);
          btree_node<gtl::internal_btree::map_params<S2CellId,S2PointIndex<int>::PointData,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2PointIndex<int>::PointData>>,256,true>>
          ::GetField<3l>((btree_node<gtl::internal_btree::map_params<S2CellId,S2PointIndex<int>::PointData,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2PointIndex<int>::PointData>>,256,true>>
                          *)this);
          iVar6 = iVar6 + 1;
        }
      }
      fVar5 = count(this);
      ptVar12 = btree_node<gtl::internal_btree::map_params<S2CellId,S2PointIndex<int>::PointData,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2PointIndex<int>::PointData>>,256,true>>
                ::GetField<1l>((btree_node<gtl::internal_btree::map_params<S2CellId,S2PointIndex<int>::PointData,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2PointIndex<int>::PointData>>,256,true>>
                                *)this);
      ptVar12[2] = fVar5 - (char)to_move;
      fVar5 = count(right);
      ptVar12 = btree_node<gtl::internal_btree::map_params<S2CellId,S2PointIndex<int>::PointData,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2PointIndex<int>::PointData>>,256,true>>
                ::GetField<1l>((btree_node<gtl::internal_btree::map_params<S2CellId,S2PointIndex<int>::PointData,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2PointIndex<int>::PointData>>,256,true>>
                                *)right);
      ptVar12[2] = fVar5 + (char)to_move;
      return;
    }
    __assert_fail("to_move <= count()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                  ,0x62b,
                  "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>]"
                 );
  }
  __assert_fail("to_move >= 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                ,0x62a,
                "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>]"
               );
}

Assistant:

void btree_node<P>::rebalance_left_to_right(const int to_move,
                                            btree_node *right,
                                            allocator_type *alloc) {
  assert(parent() == right->parent());
  assert(position() + 1 == right->position());
  assert(count() >= right->count());
  assert(to_move >= 1);
  assert(to_move <= count());

  // Values in the right node are shifted to the right to make room for the
  // new to_move values. Then, the delimiting value in the parent and the
  // other (to_move - 1) values in the left node are moved into the right node.
  // Lastly, a new delimiting value is moved from the left node into the
  // parent, and the remaining empty left node entries are destroyed.

  if (right->count() >= to_move) {
    // The original location of the right->count() values are sufficient to hold
    // the new to_move entries from the parent and left node.

    // 1) Shift existing values in the right node to their correct positions.
    right->uninitialized_move_n(to_move, right->count() - to_move,
                                right->count(), right, alloc);
    for (slot_type *src = right->slot(right->count() - to_move - 1),
                   *dest = right->slot(right->count() - 1),
                   *end = right->slot(0);
         src >= end; --src, --dest) {
      slot_type::move(alloc, src, dest);
    }

    // 2) Move the delimiting value in the parent to the right node.
    slot_type::move(alloc, parent()->slot(position()),
                    right->slot(to_move - 1));

    // 3) Move the (to_move - 1) values from the left node to the right node.
    slot_type::move(alloc, slot(count() - (to_move - 1)), slot(count()),
                    right->slot(0));
  } else {
    // The right node does not have enough initialized space to hold the new
    // to_move entries, so part of them will move to uninitialized space.

    // 1) Shift existing values in the right node to their correct positions.
    right->uninitialized_move_n(right->count(), 0, to_move, right, alloc);

    // 2) Move the delimiting value in the parent to the right node.
    right->value_init(to_move - 1, alloc, parent()->slot(position()));

    // 3) Move the (to_move - 1) values from the left node to the right node.
    const size_type uninitialized_remaining = to_move - right->count() - 1;
    uninitialized_move_n(uninitialized_remaining,
                         count() - uninitialized_remaining, right->count(),
                         right, alloc);
    slot_type::move(alloc, slot(count() - (to_move - 1)),
                    slot(count() - uninitialized_remaining), right->slot(0));
  }

  // 4) Move the new delimiting value to the parent from the left node.
  slot_type::move(alloc, slot(count() - to_move), parent()->slot(position()));

  // 5) Destroy the now-empty to_move entries in the left node.
  value_destroy_n(count() - to_move, to_move, alloc);

  if (!leaf()) {
    // Move the child pointers from the left to the right node.
    for (int i = right->count(); i >= 0; --i) {
      right->init_child(i + to_move, right->child(i));
      right->clear_child(i);
    }
    for (int i = 1; i <= to_move; ++i) {
      right->init_child(i - 1, child(count() - to_move + i));
      clear_child(count() - to_move + i);
    }
  }

  // Fixup the counts on the left and right nodes.
  set_count(count() - to_move);
  right->set_count(right->count() + to_move);
}